

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread_unix.cpp
# Opt level: O0

void __thiscall QThreadPrivate::finish(QThreadPrivate *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (anonymous_namespace)::terminate_on_exception<QThreadPrivate::finish()::__0>
            ((anon_class_8_1_8991fb9c *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QThreadPrivate::finish()
{
    terminate_on_exception([&] {
        QThreadPrivate *d = this;
        QThread *thr = q_func();

        // Disable cancellation; we're already in the finishing touches of this
        // thread, and we don't want cleanup to be disturbed by
        // abi::__forced_unwind being thrown from all kinds of functions.
#ifdef PTHREAD_CANCEL_DISABLE
        pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, nullptr);
#endif

        QMutexLocker locker(&d->mutex);

        d->threadState = QThreadPrivate::Finishing;
        locker.unlock();
        emit thr->finished(QThread::QPrivateSignal());
        QCoreApplication::sendPostedEvents(nullptr, QEvent::DeferredDelete);

        QThreadStoragePrivate::finish(&d->data->tls);
    });

    if constexpr (QT_CONFIG(broken_threadlocal_dtors))
        cleanup();
}